

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationFactoredDecPOMDPDiscrete.cpp
# Opt level: O2

double __thiscall
SimulationFactoredDecPOMDPDiscrete::RunSimulation
          (SimulationFactoredDecPOMDPDiscrete *this,JointPolicyDiscrete *jp)

{
  FactoredDecPOMDPDiscreteInterface *pFVar1;
  int iVar2;
  Index IVar3;
  uint agI;
  undefined4 extraout_var;
  ostream *poVar4;
  uint t;
  ulong uVar5;
  double sumR;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ohIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sIs;
  double r;
  allocator_type local_b9;
  JointPolicyDiscrete *local_b8;
  value_type_conflict1 local_ac;
  double local_a8;
  string local_a0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  double local_38;
  size_type __n;
  
  local_b8 = jp;
  iVar2 = (*(this->_m_puFactored->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete
            .super_PlanningUnit._vptr_PlanningUnit[6])();
  __n = CONCAT44(extraout_var,iVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,__n,
             (allocator_type *)&local_a0);
  local_a8 = 0.0;
  local_a0._M_dataplus._M_p._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,__n,
             (value_type_conflict1 *)&local_a0,(allocator_type *)&local_80);
  pFVar1 = this->_m_puFactored->_m_fDecPOMDP;
  (**(code **)(*(long *)((long)&pFVar1->field_0x0 + *(long *)(*(long *)pFVar1 + -0xf8)) + 0x1f0))
            ((long)&pFVar1->field_0x0 + *(long *)(*(long *)pFVar1 + -0xf8),&local_50);
  if ((this->super_SimulationDecPOMDPDiscrete).super_Simulation._m_verbose == true) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Simulation::RunSimulation ");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"Simulation::RunSimulation set initial state to ");
    PrintTools::SoftPrintVector<unsigned_int>
              (&local_a0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
    poVar4 = std::operator<<(poVar4,(string *)&local_a0);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  local_80._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7fffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,__n,
             (value_type_conflict1 *)&local_80,(allocator_type *)&local_ac);
  local_ac = 0x7fffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80,__n,&local_ac,
             &local_b9);
  for (t = 0; (ulong)t < (this->super_SimulationDecPOMDPDiscrete)._m_horizon; t = t + 1) {
    JointPolicyDiscrete::SampleJointActionVector
              (local_b8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0);
    Step(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0,t,
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80,&local_38,&local_a8,0.0);
    if ((ulong)t < (this->super_SimulationDecPOMDPDiscrete)._m_horizon - 1) {
      for (agI = 0; uVar5 = (ulong)agI, __n != uVar5; agI = agI + 1) {
        IVar3 = PlanningUnitMADPDiscrete::GetSuccessorOHI
                          ((PlanningUnitMADPDiscrete *)this->_m_puFactored,agI,
                           local_68._M_impl.super__Vector_impl_data._M_start[uVar5],
                           *(Index *)(CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start.
                                               _4_4_,local_80._M_impl.super__Vector_impl_data.
                                                     _M_start._0_4_) + uVar5 * 4));
        local_68._M_impl.super__Vector_impl_data._M_start[uVar5] = IVar3;
      }
    }
  }
  local_b8 = (JointPolicyDiscrete *)local_a8;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_80);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_50);
  return (double)local_b8;
}

Assistant:

double
SimulationFactoredDecPOMDPDiscrete::RunSimulation(const JointPolicyDiscrete *jp) const
{
    size_t nrAgents=_m_puFactored->GetNrAgents();
    std::vector<Index> sIs(nrAgents);
    unsigned int t;
    double r,sumR=0;

    vector<Index> ohIs(nrAgents,0); // INITIAL_OHI does not exist
    
    _m_puFactored->GetFDPOMDPD()->SampleInitialState(sIs);

    if(GetVerbose())
        cout << "Simulation::RunSimulation " << endl
             << "Simulation::RunSimulation set initial state to " 
             << SoftPrintVector(sIs) << endl;

    vector<Index> aIs(nrAgents,INT_MAX),
        oIs(nrAgents,INT_MAX);

    for(t=0;t<_m_horizon;t++)
    {	
        jp->SampleJointActionVector(ohIs,aIs);

        Step(aIs, t, sIs, oIs, r, sumR, 0);
        
        /* action taken at ts=0,...,hor-1 - therefore only observation
         * histories at ts=0,...,hor-2 have successors.*/
        if(t < _m_horizon-1) 
        {
            for(Index i=0;i!=nrAgents;++i)
                ohIs[i] = _m_puFactored->GetSuccessorOHI(i, ohIs[i], oIs[i]);
        }
    }

    return(sumR);
}